

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mddglobals.cpp
# Opt level: O1

void mdd_table(vec<IntVar_*> *x,vec<vec<int>_> *t,MDDOpts *mopts)

{
  MDDNodeInt b;
  MDDNodeInt a;
  ulong uVar1;
  uint _nvars;
  long lVar2;
  vec<int> doms;
  MDDTable tab;
  vec<int> local_f8;
  MDDOpts *local_e8;
  MDDTable local_e0;
  
  local_f8.sz = 0;
  local_f8.cap = 0;
  local_f8.data = (int *)0x0;
  _nvars = x->sz;
  if (_nvars != 0) {
    uVar1 = 0;
    do {
      local_e0.nvars = (x->data[uVar1]->max).v + 1;
      vec<int>::push(&local_f8,&local_e0.nvars);
      uVar1 = uVar1 + 1;
      _nvars = x->sz;
    } while (uVar1 < _nvars);
  }
  MDDTable::MDDTable(&local_e0,_nvars);
  local_e8 = mopts;
  if (t->sz == 0) {
    a = 0;
  }
  else {
    lVar2 = 0;
    uVar1 = 0;
    a = 0;
    do {
      b = MDDTable::tuple<int>(&local_e0,(vec<int> *)((long)&t->data->sz + lVar2));
      a = MDDTable::mdd_or(&local_e0,a,b);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar1 < t->sz);
  }
  addMDDProp(x,&local_e0,a,local_e8);
  MDDTable::~MDDTable(&local_e0);
  if (local_f8.data != (int *)0x0) {
    free(local_f8.data);
  }
  return;
}

Assistant:

void mdd_table(vec<IntVar*>& x, vec<vec<int> >& t, const MDDOpts& mopts) {
	vec<int> doms;

	int maxdom = 0;
	for (unsigned int i = 0; i < x.size(); i++) {
		// assert(x[i]->getMin() == 0);
		doms.push(x[i]->getMax() + 1);

		// Could also generate maxdom from tuples.
		if ((x[i]->getMax() + 1) > maxdom) {
			maxdom = x[i]->getMax() + 1;
		}
	}
	MDDTable tab(x.size());

	// Assumes a positive table.
	const MDDNodeInt m(mdd_table(tab, x.size(), doms, t, true));

	//   tab.print_mdd_tikz(m);

	addMDDProp(x, tab, m, mopts);
}